

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  node *pnVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  nodecontext Context;
  node *p [10000];
  nodecontext nStack_13988;
  undefined8 auStack_13898 [10000];
  
  NodeContext_Init(&nStack_13988,(nodemeta *)0x0,(cc_memheap *)0x0,(cc_memheap *)0x0);
  for (lVar3 = 0; lVar3 != 10000; lVar3 = lVar3 + 1) {
    pnVar1 = NodeCreate(&nStack_13988,0x45444f4e);
    auStack_13898[lVar3] = pnVar1;
  }
  iVar2 = 1000000;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    pnVar1 = NodeCreate(&nStack_13988,0x45444f4e);
    NodeDelete(pnVar1);
  }
  for (lVar3 = 0; lVar3 != 10000; lVar3 = lVar3 + 1) {
    NodeDelete((node *)auStack_13898[lVar3]);
  }
  NodeContext_Done(&nStack_13988);
  return 0;
}

Assistant:

int main(int UNUSED_PARAM(argc),char** UNUSED_PARAM(argv))
{
    node* p[10000];
    int i;
    nodecontext Context;
    NodeContext_Init(&Context,NULL,NULL,NULL);

    for (i=0;i<10000;++i)
        p[i] = NodeCreate(&Context,NODE_CLASS);

    for (i=0;i<1000000;++i)
        NodeDelete(NodeCreate(&Context,NODE_CLASS));

    for (i=0;i<10000;++i)
        NodeDelete(p[i]);

    NodeContext_Done(&Context);
    return 0;
}